

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.h
# Opt level: O0

void makect(int nc,int *ip,float *c)

{
  int iVar1;
  float *in_RDX;
  long in_RSI;
  int in_EDI;
  float fVar2;
  double dVar3;
  float delta;
  int nch;
  int j;
  int local_1c;
  
  *(int *)(in_RSI + 4) = in_EDI;
  if (1 < in_EDI) {
    iVar1 = in_EDI >> 1;
    dVar3 = atan(1.0);
    fVar2 = (float)(dVar3 / (double)iVar1);
    dVar3 = std::cos((double)(ulong)(uint)(fVar2 * (float)iVar1));
    *in_RDX = SUB84(dVar3,0);
    in_RDX[iVar1] = *in_RDX * 0.5;
    for (local_1c = 1; local_1c < iVar1; local_1c = local_1c + 1) {
      dVar3 = std::cos((double)(ulong)(uint)(fVar2 * (float)local_1c));
      in_RDX[local_1c] = SUB84(dVar3,0) * 0.5;
      dVar3 = std::sin((double)(ulong)(uint)(fVar2 * (float)local_1c));
      in_RDX[in_EDI - local_1c] = SUB84(dVar3,0) * 0.5;
    }
  }
  return;
}

Assistant:

void makect(int nc, int *ip, float *c)
{
    int j, nch;
    float delta;

    ip[1] = nc;
    if (nc > 1) {
        nch = nc >> 1;
        delta = atan(1.0) / nch;
        c[0] = cos(delta * nch);
        c[nch] = 0.5 * c[0];
        for (j = 1; j < nch; j++) {
            c[j] = 0.5 * cos(delta * j);
            c[nc - j] = 0.5 * sin(delta * j);
        }
    }
}